

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceFinder.cc
# Opt level: O0

void __thiscall
ResourceFinder::handleObject
          (ResourceFinder *this,QPDFObjectHandle *obj,size_t offset,size_t param_3)

{
  string *__return_storage_ptr__;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  pointer ppVar4;
  mapped_type *this_00;
  mapped_type *this_01;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_388;
  string local_360;
  _Base_ptr local_340;
  undefined1 local_338;
  _Base_ptr local_330;
  undefined1 local_328;
  _Self local_320;
  _Self local_318;
  iterator iter;
  string resource_type;
  string op;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  size_t param_4_local;
  size_t offset_local;
  QPDFObjectHandle *obj_local;
  ResourceFinder *this_local;
  
  local_28 = (undefined1  [8])param_3;
  param_4_local = offset;
  offset_local = (size_t)obj;
  obj_local = (QPDFObjectHandle *)this;
  bVar1 = QPDFObjectHandle::isOperator(obj);
  if ((bVar1) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    if ((handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::op_to_rtype_abi_cxx11_ == '\0')
       && (iVar2 = __cxa_guard_acquire(&handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::
                                        op_to_rtype_abi_cxx11_), iVar2 != 0)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[12],_true>
                (&local_2b8,(char (*) [3])0x42dc86,(char (*) [12])"/ColorSpace");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[12],_true>
                (&local_278,(char (*) [3])"cs",(char (*) [12])"/ColorSpace");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[11],_true>
                (&local_238,(char (*) [3])0x410c75,(char (*) [11])"/ExtGState");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[6],_true>
                (&local_1f8,(char (*) [3])0x41417b,(char (*) [6])"/Font");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[9],_true>
                (&local_1b8,(char (*) [4])"SCN",(char (*) [9])"/Pattern");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[9],_true>
                (&local_178,(char (*) [4])"scn",(char (*) [9])"/Pattern");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[12],_true>
                (&local_138,(char (*) [4])"BDC",(char (*) [12])"/Properties");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[12],_true>
                (&local_f8,(char (*) [3])0x42dc92,(char (*) [12])"/Properties");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[9],_true>
                (&local_b8,(char (*) [3])0x41de6a,(char (*) [9])"/Shading");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[9],_true>
                (&local_78,(char (*) [3])"Do",(char (*) [9])"/XObject");
      local_38 = &local_2b8;
      local_30 = 10;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(op.field_2._M_local_buf + 10));
      __l._M_len = local_30;
      __l._M_array = local_38;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::op_to_rtype_abi_cxx11_,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(op.field_2._M_local_buf + 0xb),
            (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(op.field_2._M_local_buf + 10));
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(op.field_2._M_local_buf + 10));
      local_388 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_38;
      do {
        local_388 = local_388 + -1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(local_388);
      } while (local_388 != &local_2b8);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::
                           op_to_rtype_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::
                           op_to_rtype_abi_cxx11_);
    }
    __return_storage_ptr__ = (string *)((long)&resource_type.field_2 + 8);
    QPDFObjectHandle::getOperatorValue_abi_cxx11_(__return_storage_ptr__,obj);
    std::__cxx11::string::string((string *)&iter);
    local_318._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::op_to_rtype_abi_cxx11_,
                __return_storage_ptr__);
    local_320._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&handleObject(QPDFObjectHandle,unsigned_long,unsigned_long)::op_to_rtype_abi_cxx11_);
    bVar1 = std::operator!=(&local_318,&local_320);
    if (bVar1) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_318);
      std::__cxx11::string::operator=((string *)&iter,(string *)&ppVar4->second);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&this->names,&this->last_name);
      local_330 = (_Base_ptr)pVar5.first._M_node;
      local_328 = pVar5.second;
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                ::operator[](&this->names_by_resource_type,(key_type *)&iter);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                ::operator[](this_00,&this->last_name);
      pVar6 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              insert(this_01,&this->last_name_offset);
      local_340 = (_Base_ptr)pVar6.first._M_node;
      local_338 = pVar6.second;
    }
    std::__cxx11::string::~string((string *)&iter);
    std::__cxx11::string::~string((string *)(resource_type.field_2._M_local_buf + 8));
  }
  else {
    bVar1 = QPDFObjectHandle::isName(obj);
    if (bVar1) {
      QPDFObjectHandle::getName_abi_cxx11_(&local_360,obj);
      std::__cxx11::string::operator=((string *)&this->last_name,(string *)&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      this->last_name_offset = param_4_local;
    }
  }
  return;
}

Assistant:

void
ResourceFinder::handleObject(QPDFObjectHandle obj, size_t offset, size_t)
{
    if (obj.isOperator() && (!this->last_name.empty())) {
        static std::map<std::string, std::string> op_to_rtype = {
            {"CS", "/ColorSpace"},
            {"cs", "/ColorSpace"},
            {"gs", "/ExtGState"},
            {"Tf", "/Font"},
            {"SCN", "/Pattern"},
            {"scn", "/Pattern"},
            {"BDC", "/Properties"},
            {"DP", "/Properties"},
            {"sh", "/Shading"},
            {"Do", "/XObject"},
        };
        std::string op = obj.getOperatorValue();
        std::string resource_type;
        auto iter = op_to_rtype.find(op);
        if (iter != op_to_rtype.end()) {
            resource_type = iter->second;
        }
        if (!resource_type.empty()) {
            this->names.insert(this->last_name);
            this->names_by_resource_type[resource_type][this->last_name].insert(
                this->last_name_offset);
        }
    } else if (obj.isName()) {
        this->last_name = obj.getName();
        this->last_name_offset = offset;
    }
}